

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-to-source.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  pointer ppVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  ulong *puVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  size_type sVar11;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  raw_ostream *prVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long *plVar19;
  char ch;
  uint cur_line;
  uint local_814;
  ulong local_810;
  ulong local_808;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> lines;
  ifstream ifs;
  undefined4 uStack_7ac;
  long local_7a0;
  uint auStack_790 [4];
  long local_780;
  long local_778;
  long local_768;
  SMDiagnostic SMD;
  ifstream ifs_1;
  undefined4 uStack_434;
  undefined4 local_430 [2];
  undefined8 local_428;
  undefined4 *local_420;
  undefined4 *local_418;
  undefined8 local_410;
  
  llvm::cl::ParseCommandLineOptions
            (argc,argv,(StringRef)ZEXT816(0x107038),(raw_ostream *)0x0,(char *)0x0,false);
  llvm::LLVMContext::LLVMContext(&context);
  SMD.Filename._M_dataplus._M_p = (pointer)&SMD.Filename.field_2;
  SMD.SM = (SourceMgr *)0x0;
  SMD.Loc.Ptr = (char *)0x0;
  SMD.Filename._M_string_length = 0;
  SMD.Filename.field_2._M_local_buf[0] = '\0';
  SMD.LineNo = 0;
  SMD.ColumnNo = 0;
  SMD.Kind = DK_Error;
  SMD.Message._M_dataplus._M_p = (pointer)&SMD.Message.field_2;
  SMD.Message._M_string_length = 0;
  SMD.Message.field_2._M_local_buf[0] = '\0';
  SMD.LineContents._M_dataplus._M_p = (pointer)&SMD.LineContents.field_2;
  SMD.LineContents._M_string_length = 0;
  SMD.LineContents.field_2._M_local_buf[0] = '\0';
  SMD.Ranges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SMD.Ranges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SMD.Ranges.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SMD.FixIts.super_SmallVectorImpl<llvm::SMFixIt>.
  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.BeginX =
       &SMD.FixIts.super_SmallVectorStorage<llvm::SMFixIt,_4U>;
  SMD.FixIts.super_SmallVectorImpl<llvm::SMFixIt>.
  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.Size = 0;
  SMD.FixIts.super_SmallVectorImpl<llvm::SMFixIt>.
  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase<unsigned_int>.Capacity
       = 4;
  llvm::parseIRFile(&M,inputFile_abi_cxx11_._128_8_,inputFile_abi_cxx11_._136_8_,&SMD,&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    prVar14 = (raw_ostream *)llvm::errs();
    prVar14 = llvm::raw_ostream::operator<<(prVar14,"Failed parsing \'");
    prVar14 = llvm::raw_ostream::operator<<(prVar14,(string *)(inputFile_abi_cxx11_ + 0x80));
    llvm::raw_ostream::operator<<(prVar14,"\' file:\n");
    prVar14 = (raw_ostream *)*argv;
    bVar6 = (bool)llvm::errs();
    iVar16 = 1;
    llvm::SMDiagnostic::print((char *)&SMD,prVar14,bVar6,true);
    goto LAB_00105b6d;
  }
  lines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &lines._M_t._M_impl.super__Rb_tree_header._M_header;
  lines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  lines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_808 = (long)M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                    _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                    super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x18;
  puVar8 = (ulong *)((long)M._M_t.
                           super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                           .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x20);
  lines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       lines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (uVar1 = *puVar8, uVar1 != local_808) {
    lVar15 = uVar1 - 0x38;
    if (uVar1 == 0) {
      lVar15 = 0;
    }
    plVar19 = (long *)(lVar15 + 0x50);
    local_810 = uVar1;
    while (lVar2 = *plVar19, lVar2 != lVar15 + 0x48) {
      lVar17 = lVar2 + -0x18;
      if (lVar2 == 0) {
        lVar17 = 0;
      }
      plVar19 = (long *)(lVar17 + 0x30);
      while (lVar3 = *plVar19, lVar3 != lVar17 + 0x28) {
        lVar18 = lVar3 + -0x18;
        if (lVar3 == 0) {
          lVar18 = 0;
        }
        if (*(long *)(lVar18 + 0x30) != 0) {
          _ifs_1 = llvm::DebugLoc::getLine();
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&lines._M_t,(uint *)&ifs_1);
        }
        plVar19 = (long *)(lVar3 + 8);
      }
      plVar19 = (long *)(lVar2 + 8);
    }
    puVar8 = (ulong *)(local_810 + 8);
  }
  p_Var13 = lines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sourceFile_abi_cxx11_._136_8_ == 0) {
    for (; (_Rb_tree_header *)p_Var13 != &lines._M_t._M_impl.super__Rb_tree_header;
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar12,"\n");
    }
LAB_00105b61:
    iVar16 = 0;
  }
  else {
    std::ifstream::ifstream(&ifs_1,(string *)(sourceFile_abi_cxx11_ + 0x80),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if ((cVar5 == '\0') ||
       ((*(byte *)((long)&local_418 + *(long *)(CONCAT44(uStack_434,_ifs_1) + -0x18)) & 1) != 0)) {
      prVar14 = (raw_ostream *)llvm::errs();
      prVar14 = llvm::raw_ostream::operator<<(prVar14,"Failed opening given source file: ");
      prVar14 = llvm::raw_ostream::operator<<(prVar14,(string *)(sourceFile_abi_cxx11_ + 0x80));
      llvm::raw_ostream::operator<<(prVar14,"\n");
      abort();
    }
    cur_line = 1;
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)&ifs
              );
    while (plVar19 = (long *)std::istream::get((char *)&ifs_1),
          (*(byte *)((long)plVar19 + *(long *)(*plVar19 + -0x18) + 0x20) & 5) == 0) {
      if (ch == '}') {
        lVar15 = local_780;
        if (local_780 == local_778) {
          lVar15 = *(long *)(local_768 + -8) + 0x200;
        }
        matching_braces.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start[*(uint *)(lVar15 + -4)].second = cur_line;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&ifs);
      }
      else if (ch == '{') {
        local_814 = (uint)((ulong)((long)matching_braces.
                                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)matching_braces.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&ifs,&local_814);
        local_814 = 0;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<unsigned_int&,int>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&matching_braces,&cur_line,(int *)&local_814);
      }
      else if ((ch == '\n') && (cur_line = cur_line + 1, local_780 != local_7a0)) {
        lVar15 = local_780;
        if (local_780 == local_778) {
          lVar15 = *(long *)(local_768 + -8) + 0x200;
        }
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::_M_emplace_unique<unsigned_int&,unsigned_int&>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    *)&nesting_structure,&cur_line,(uint *)(lVar15 + -4));
      }
    }
    std::ifstream::close();
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
              ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ifs);
    std::ifstream::~ifstream
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&ifs_1);
    do {
      local_810 = lines._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_430[0] = 0;
      local_428 = 0;
      local_420 = local_430;
      local_410 = 0;
      local_418 = local_420;
      for (p_Var10 = lines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &lines._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        _ifs = p_Var10[1]._M_color;
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&ifs_1,(uint *)&ifs);
        iVar9 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::find(&nesting_structure._M_t,(key_type *)&ifs);
        ppVar4 = matching_braces.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((_Rb_tree_header *)iVar9._M_node !=
            &nesting_structure._M_t._M_impl.super__Rb_tree_header) {
          uVar7 = *(uint *)&iVar9._M_node[1].field_0x4;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&ifs_1,
                     &matching_braces.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].first);
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&ifs_1,&ppVar4[uVar7].second);
        }
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::swap(&lines._M_t,
             (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&ifs_1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifs_1);
    } while (local_810 < lines._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ifstream::ifstream(&ifs,(string *)(sourceFile_abi_cxx11_ + 0x80),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if ((cVar5 == '\0') ||
       (uVar7 = *(uint *)((long)auStack_790 + *(long *)(CONCAT44(uStack_7ac,_ifs) + -0x18)),
       (uVar7 & 1) != 0)) {
      prVar14 = (raw_ostream *)llvm::errs();
      prVar14 = llvm::raw_ostream::operator<<(prVar14,"Failed opening given source file: ");
      prVar14 = llvm::raw_ostream::operator<<(prVar14,(string *)(sourceFile_abi_cxx11_ + 0x80));
      llvm::raw_ostream::operator<<(prVar14,"\n");
      iVar16 = 1;
      bVar6 = false;
    }
    else {
      cur_line = 1;
      while ((uVar7 & 2) == 0) {
        std::istream::getline((char *)&ifs,(long)&ifs_1);
        sVar11 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 count(&lines,&cur_line);
        if (sVar11 != 0) {
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::operator<<(poVar12,": ");
          poVar12 = std::operator<<((ostream *)&std::cout,(char *)&ifs_1);
          std::operator<<(poVar12,"\n");
        }
        uVar7 = *(uint *)((long)auStack_790 + *(long *)(CONCAT44(uStack_7ac,_ifs) + -0x18));
        if ((uVar7 & 1) != 0) {
          prVar14 = (raw_ostream *)llvm::errs();
          llvm::raw_ostream::operator<<(prVar14,"An error occured\n");
          break;
        }
        cur_line = cur_line + 1;
      }
      std::ifstream::close();
      iVar16 = 0;
      bVar6 = true;
    }
    std::ifstream::~ifstream(&ifs);
    if (bVar6) goto LAB_00105b61;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&lines._M_t);
LAB_00105b6d:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::SMDiagnostic::~SMDiagnostic(&SMD);
  llvm::LLVMContext::~LLVMContext(&context);
  return iVar16;
}

Assistant:

int main(int argc, char *argv[]) {
    llvm::cl::ParseCommandLineOptions(argc, argv);

    llvm::LLVMContext context;
    llvm::SMDiagnostic SMD;

    std::unique_ptr<llvm::Module> M =
            llvm::parseIRFile(inputFile, SMD, context);
    if (!M) {
        llvm::errs() << "Failed parsing '" << inputFile << "' file:\n";
        SMD.print(argv[0], llvm::errs());
        return 1;
    }

    // FIXME find out if we have debugging info at all
    // no difficult machineris - just find out
    // which lines are in our module and print them
    std::set<unsigned> lines;
    get_lines_from_module(*M, lines);

    if (sourceFile.empty())
        print_lines_numbers(lines);
    else {
        get_nesting_structure(sourceFile);
        /* fill in the lines with braces */
        /* really not efficient, but easy */
        size_t old_size;
        do {
            old_size = lines.size();
            std::set<unsigned> new_lines;

            for (unsigned i : lines) {
                new_lines.insert(i);
                auto it = nesting_structure.find(i);
                if (it != nesting_structure.end()) {
                    auto &pr = matching_braces[it->second];
                    new_lines.insert(pr.first);
                    new_lines.insert(pr.second);
                }
            }

            lines.swap(new_lines);
        } while (lines.size() > old_size);

        std::ifstream ifs(sourceFile);
        if (!ifs.is_open() || ifs.bad()) {
            llvm::errs() << "Failed opening given source file: " << sourceFile
                         << "\n";
            return 1;
        }

        // print_lines_numbers(lines);
        print_lines(ifs, lines);
        ifs.close();
    }

    return 0;
}